

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_1::BinaryWriter::WriteU32Leb128WithReloc
          (BinaryWriter *this,Index index,char *desc,RelocType reloc_type)

{
  pointer *ppRVar1;
  undefined8 *puVar2;
  Index IVar3;
  pointer pRVar4;
  pointer pRVar5;
  pointer __src;
  size_t sVar6;
  char *pcVar7;
  pointer pRVar8;
  pointer pRVar9;
  iterator iVar10;
  mapped_type *pmVar11;
  ulong uVar12;
  pointer pSVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  mapped_type mVar17;
  pointer pRVar18;
  SymbolType SVar19;
  size_t offset;
  SymbolType local_6c;
  char *local_68;
  size_t local_60;
  unsigned_long local_58;
  key_type local_50;
  
  if (this->options_->relocatable != true) {
    WriteU32Leb128(this->stream_,index,desc);
    return;
  }
  local_6c = reloc_type;
  if ((this->current_reloc_section_ == (RelocSection *)0x0) ||
     (this->current_reloc_section_->section_index != this->section_count_)) {
    pcVar7 = GetSectionName(this->last_section_type_);
    pRVar4 = (this->reloc_sections_).
             super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar4 == (this->reloc_sections_).
                  super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      pRVar5 = (this->reloc_sections_).
               super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_68 = desc;
      if ((long)pRVar4 - (long)pRVar5 == 0x7ffffffffffffff8) goto LAB_001443cc;
      lVar14 = (long)pRVar4 - (long)pRVar5 >> 3;
      uVar16 = lVar14 * -0x3333333333333333;
      uVar12 = 1;
      if (pRVar4 != pRVar5) {
        uVar12 = uVar16;
      }
      uVar15 = uVar12 + uVar16;
      if (0x333333333333332 < uVar15) {
        uVar15 = 0x333333333333333;
      }
      if (CARRY8(uVar12,uVar16)) {
        uVar15 = 0x333333333333333;
      }
      if (uVar15 == 0) {
        pRVar8 = (pointer)0x0;
      }
      else {
        pRVar8 = (pointer)operator_new(uVar15 * 0x28);
      }
      desc = local_68;
      IVar3 = this->section_count_;
      (&pRVar8->name)[lVar14] = pcVar7;
      (&pRVar8->section_index)[lVar14 * 2] = IVar3;
      puVar2 = (undefined8 *)
               ((long)&(pRVar8->relocations).
                       super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl +
               lVar14 * 8);
      *puVar2 = 0;
      puVar2[1] = 0;
      *(undefined8 *)
       ((long)&(pRVar8->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>.
               _M_impl + lVar14 * 8 + 0x10) = 0;
      pRVar18 = pRVar8;
      for (pRVar9 = pRVar5; pRVar4 != pRVar9; pRVar9 = pRVar9 + 1) {
        pRVar18->section_index = pRVar9->section_index;
        pRVar18->name = pRVar9->name;
        (pRVar18->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl
        .super__Vector_impl_data._M_start =
             (pRVar9->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>.
             _M_impl.super__Vector_impl_data._M_start;
        *(pointer *)
         ((long)&(pRVar18->relocations).
                 super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl + 8) =
             (pRVar9->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        *(pointer *)
         ((long)&(pRVar18->relocations).
                 super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl + 0x10) =
             (pRVar9->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
        (pRVar9->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pRVar9->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pRVar9->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pRVar18 = pRVar18 + 1;
      }
      if (pRVar5 != (pointer)0x0) {
        operator_delete(pRVar5);
      }
      (this->reloc_sections_).
      super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
      ._M_impl.super__Vector_impl_data._M_start = pRVar8;
      (this->reloc_sections_).
      super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
      ._M_impl.super__Vector_impl_data._M_finish = pRVar18 + 1;
      (this->reloc_sections_).
      super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pRVar8 + uVar15;
    }
    else {
      IVar3 = this->section_count_;
      pRVar4->name = pcVar7;
      pRVar4->section_index = IVar3;
      (pRVar4->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pRVar4->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pRVar4->relocations).super__Vector_base<wabt::Reloc,_std::allocator<wabt::Reloc>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ppRVar1 = &(this->reloc_sections_).
                 super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppRVar1 = *ppRVar1 + 1;
    }
    this->current_reloc_section_ =
         (this->reloc_sections_).
         super__Vector_base<wabt::(anonymous_namespace)::RelocSection,_std::allocator<wabt::(anonymous_namespace)::RelocSection>_>
         ._M_impl.super__Vector_impl_data._M_finish + -1;
  }
  local_58 = this->stream_->offset_ - this->last_section_payload_offset_;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  SVar19 = local_6c;
  if (local_6c != Function) {
    if (local_6c != (Event|Section)) {
      _GLOBAL__N_1::BinaryWriter::WriteU32Leb128WithReloc((BinaryWriter *)(ulong)local_6c);
      mVar17 = 0xffffffff;
      goto LAB_0014436f;
    }
    SVar19 = Global;
  }
  std::__cxx11::string::_M_assign((string *)&local_50);
  iVar10 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&(this->symtab_)._M_h,&local_50);
  if (iVar10.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
      ._M_cur == (__node_type *)0x0) {
    mVar17 = (int)((ulong)((long)(this->symbols_).
                                 super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->symbols_).
                                super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
    pmVar11 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->symtab_,&local_50);
    *pmVar11 = mVar17;
    pSVar13 = (this->symbols_).
              super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (pSVar13 ==
        (this->symbols_).
        super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      __src = (this->symbols_).
              super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
              ._M_impl.super__Vector_impl_data._M_start;
      local_60 = (long)pSVar13 - (long)__src;
      local_68 = desc;
      if (local_60 == 0x7ffffffffffffff8) {
LAB_001443cc:
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      lVar14 = (long)local_60 >> 2;
      uVar16 = lVar14 * -0x5555555555555555;
      uVar12 = 1;
      if (pSVar13 != __src) {
        uVar12 = uVar16;
      }
      uVar15 = uVar12 + uVar16;
      if (0xaaaaaaaaaaaaaa9 < uVar15) {
        uVar15 = 0xaaaaaaaaaaaaaaa;
      }
      if (CARRY8(uVar12,uVar16)) {
        uVar15 = 0xaaaaaaaaaaaaaaa;
      }
      if (uVar15 == 0) {
        pSVar13 = (pointer)0x0;
      }
      else {
        pSVar13 = (pointer)operator_new(uVar15 * 0xc);
      }
      sVar6 = local_60;
      (&pSVar13->symbol_index)[lVar14] = mVar17;
      (&pSVar13->type)[lVar14] = SVar19;
      (&pSVar13->element_index)[lVar14] = index;
      if (0 < (long)local_60) {
        memmove(pSVar13,__src,local_60);
      }
      desc = local_68;
      if (__src != (pointer)0x0) {
        operator_delete(__src);
      }
      (this->symbols_).
      super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
      ._M_impl.super__Vector_impl_data._M_start = pSVar13;
      (this->symbols_).
      super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)&pSVar13[1].symbol_index + sVar6)
      ;
      (this->symbols_).
      super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar13 + uVar15;
    }
    else {
      pSVar13->symbol_index = mVar17;
      pSVar13->type = SVar19;
      pSVar13->element_index = index;
      (this->symbols_).
      super__Vector_base<wabt::(anonymous_namespace)::Symbol,_std::allocator<wabt::(anonymous_namespace)::Symbol>_>
      ._M_impl.super__Vector_impl_data._M_finish = pSVar13 + 1;
    }
  }
  else {
    mVar17 = *(mapped_type *)
              ((long)iVar10.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_true>
                     ._M_cur + 0x28);
  }
LAB_0014436f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  local_50._M_dataplus._M_p._0_4_ = mVar17;
  std::vector<wabt::Reloc,std::allocator<wabt::Reloc>>::
  emplace_back<wabt::RelocType&,unsigned_long&,unsigned_int&>
            ((vector<wabt::Reloc,std::allocator<wabt::Reloc>> *)
             &this->current_reloc_section_->relocations,&local_6c,&local_58,(uint *)&local_50);
  WriteFixedU32Leb128(this->stream_,index,desc);
  return;
}

Assistant:

void BinaryWriter::WriteU32Leb128WithReloc(Index index,
                                           const char* desc,
                                           RelocType reloc_type) {
  if (options_.relocatable) {
    AddReloc(reloc_type, index);
    WriteFixedU32Leb128(stream_, index, desc);
  } else {
    WriteU32Leb128(stream_, index, desc);
  }
}